

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NeuralNetwork_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007225f8 == '\x01') {
    DAT_007225f8 = '\0';
    (*(code *)*_NeuralNetwork_default_instance_)();
  }
  if (DAT_00722628 == '\x01') {
    DAT_00722628 = '\0';
    (*(code *)*_NeuralNetworkImageScaler_default_instance_)();
  }
  if (DAT_00722658 == '\x01') {
    DAT_00722658 = '\0';
    (*(code *)*_NeuralNetworkMeanImage_default_instance_)();
  }
  if (DAT_00722688 == '\x01') {
    DAT_00722688 = '\0';
    (*(code *)*_NeuralNetworkPreprocessing_default_instance_)();
  }
  if (DAT_007226b8 == '\x01') {
    DAT_007226b8 = '\0';
    (*(code *)*_ActivationReLU_default_instance_)();
  }
  if (DAT_007226d8 == '\x01') {
    DAT_007226d8 = '\0';
    (*(code *)*_ActivationLeakyReLU_default_instance_)();
  }
  if (DAT_007226f8 == '\x01') {
    DAT_007226f8 = '\0';
    (*(code *)*_ActivationTanh_default_instance_)();
  }
  if (DAT_00722720 == '\x01') {
    DAT_00722720 = '\0';
    (*(code *)*_ActivationScaledTanh_default_instance_)();
  }
  if (DAT_00722740 == '\x01') {
    DAT_00722740 = '\0';
    (*(code *)*_ActivationSigmoid_default_instance_)();
  }
  if (DAT_00722768 == '\x01') {
    DAT_00722768 = '\0';
    (*(code *)*_ActivationLinear_default_instance_)();
  }
  if (DAT_00722790 == '\x01') {
    DAT_00722790 = '\0';
    (*(code *)*_ActivationSigmoidHard_default_instance_)();
  }
  if (DAT_007227b8 == '\x01') {
    DAT_007227b8 = '\0';
    (*(code *)*_ActivationPReLU_default_instance_)();
  }
  if (DAT_007227d8 == '\x01') {
    DAT_007227d8 = '\0';
    (*(code *)*_ActivationELU_default_instance_)();
  }
  if (DAT_007227f8 == '\x01') {
    DAT_007227f8 = '\0';
    (*(code *)*_ActivationThresholdedReLU_default_instance_)();
  }
  if (DAT_00722818 == '\x01') {
    DAT_00722818 = '\0';
    (*(code *)*_ActivationSoftsign_default_instance_)();
  }
  if (DAT_00722838 == '\x01') {
    DAT_00722838 = '\0';
    (*(code *)*_ActivationSoftplus_default_instance_)();
  }
  if (DAT_00722868 == '\x01') {
    DAT_00722868 = '\0';
    (*(code *)*_ActivationParametricSoftplus_default_instance_)();
  }
  if (DAT_00722890 == '\x01') {
    DAT_00722890 = '\0';
    (*(code *)*_ActivationParams_default_instance_)();
  }
  if (DAT_00722930 == '\x01') {
    DAT_00722930 = '\0';
    (*(code *)*_Tensor_default_instance_)();
  }
  if (DAT_007229c8 == '\x01') {
    DAT_007229c8 = '\0';
    (*(code *)*_NeuralNetworkLayer_default_instance_)();
  }
  if (DAT_00722ee8 == '\x01') {
    DAT_00722ee8 = '\0';
    (*(code *)*_BranchLayerParams_default_instance_)();
  }
  if (DAT_00722f28 == '\x01') {
    DAT_00722f28 = '\0';
    (*(code *)*_LoopLayerParams_default_instance_)();
  }
  if (DAT_00722f48 == '\x01') {
    DAT_00722f48 = '\0';
    (*(code *)*_LoopBreakLayerParams_default_instance_)();
  }
  if (DAT_00722f68 == '\x01') {
    DAT_00722f68 = '\0';
    (*(code *)*_LoopContinueLayerParams_default_instance_)();
  }
  if (DAT_00722f88 == '\x01') {
    DAT_00722f88 = '\0';
    (*(code *)*_CopyLayerParams_default_instance_)();
  }
  if (DAT_00722fa8 == '\x01') {
    DAT_00722fa8 = '\0';
    (*(code *)*_GreaterThanLayerParams_default_instance_)();
  }
  if (DAT_00722fc8 == '\x01') {
    DAT_00722fc8 = '\0';
    (*(code *)*_GreaterEqualLayerParams_default_instance_)();
  }
  if (DAT_00722fe8 == '\x01') {
    DAT_00722fe8 = '\0';
    (*(code *)*_LessThanLayerParams_default_instance_)();
  }
  if (DAT_00723008 == '\x01') {
    DAT_00723008 = '\0';
    (*(code *)*_LessEqualLayerParams_default_instance_)();
  }
  if (DAT_00723028 == '\x01') {
    DAT_00723028 = '\0';
    (*(code *)*_EqualLayerParams_default_instance_)();
  }
  if (DAT_00723048 == '\x01') {
    DAT_00723048 = '\0';
    (*(code *)*_NotEqualLayerParams_default_instance_)();
  }
  if (DAT_00723068 == '\x01') {
    DAT_00723068 = '\0';
    (*(code *)*_LogicalAndLayerParams_default_instance_)();
  }
  if (DAT_00723088 == '\x01') {
    DAT_00723088 = '\0';
    (*(code *)*_LogicalOrLayerParams_default_instance_)();
  }
  if (DAT_007230a8 == '\x01') {
    DAT_007230a8 = '\0';
    (*(code *)*_LogicalXorLayerParams_default_instance_)();
  }
  if (DAT_007230c8 == '\x01') {
    DAT_007230c8 = '\0';
    (*(code *)*_LogicalNotLayerParams_default_instance_)();
  }
  if (DAT_007230f8 == '\x01') {
    DAT_007230f8 = '\0';
    (*(code *)*_BorderAmounts_EdgeSizes_default_instance_)();
  }
  if (DAT_00723130 == '\x01') {
    DAT_00723130 = '\0';
    (*(code *)*_BorderAmounts_default_instance_)();
  }
  if (DAT_00723158 == '\x01') {
    DAT_00723158 = '\0';
    (*(code *)*_ValidPadding_default_instance_)();
  }
  if (DAT_00723178 == '\x01') {
    DAT_00723178 = '\0';
    (*(code *)*_SamePadding_default_instance_)();
  }
  if (DAT_00723198 == '\x01') {
    DAT_00723198 = '\0';
    (*(code *)*_SamplingMode_default_instance_)();
  }
  if (DAT_007231b8 == '\x01') {
    DAT_007231b8 = '\0';
    (*(code *)*_BoxCoordinatesMode_default_instance_)();
  }
  if (DAT_00723210 == '\x01') {
    DAT_00723210 = '\0';
    (*(code *)*_WeightParams_default_instance_)();
  }
  if (DAT_00723240 == '\x01') {
    DAT_00723240 = '\0';
    (*(code *)*_QuantizationParams_default_instance_)();
  }
  if (DAT_00723298 == '\x01') {
    DAT_00723298 = '\0';
    (*(code *)*_LinearQuantizationParams_default_instance_)();
  }
  if (DAT_007232c8 == '\x01') {
    DAT_007232c8 = '\0';
    (*(code *)*_LookUpTableQuantizationParams_default_instance_)();
  }
  if (DAT_00723380 == '\x01') {
    DAT_00723380 = '\0';
    (*(code *)*_ConvolutionLayerParams_default_instance_)();
  }
  if (DAT_00723428 == '\x01') {
    DAT_00723428 = '\0';
    (*(code *)*_Convolution3DLayerParams_default_instance_)();
  }
  if (DAT_00723468 == '\x01') {
    DAT_00723468 = '\0';
    (*(code *)*_InnerProductLayerParams_default_instance_)();
  }
  if (DAT_007234a8 == '\x01') {
    DAT_007234a8 = '\0';
    (*(code *)*_EmbeddingLayerParams_default_instance_)();
  }
  if (DAT_007234e8 == '\x01') {
    DAT_007234e8 = '\0';
    (*(code *)*_EmbeddingNDLayerParams_default_instance_)();
  }
  if (DAT_00723538 == '\x01') {
    DAT_00723538 = '\0';
    (*(code *)*_BatchnormLayerParams_default_instance_)();
  }
  if (DAT_00723568 == '\x01') {
    DAT_00723568 = '\0';
    (*(code *)*_PoolingLayerParams_ValidCompletePadding_default_instance_)();
  }
  if (DAT_007235c8 == '\x01') {
    DAT_007235c8 = '\0';
    (*(code *)*_PoolingLayerParams_default_instance_)();
  }
  if (DAT_00723638 == '\x01') {
    DAT_00723638 = '\0';
    (*(code *)*_Pooling3DLayerParams_default_instance_)();
  }
  if (DAT_00723658 == '\x01') {
    DAT_00723658 = '\0';
    (*(code *)*_GlobalPooling3DLayerParams_default_instance_)();
  }
  if (DAT_00723678 == '\x01') {
    DAT_00723678 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingConstant_default_instance_)();
  }
  if (DAT_00723698 == '\x01') {
    DAT_00723698 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReflection_default_instance_)();
  }
  if (DAT_007236b8 == '\x01') {
    DAT_007236b8 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReplication_default_instance_)();
  }
  if (DAT_007236e8 == '\x01') {
    DAT_007236e8 = '\0';
    (*(code *)*_PaddingLayerParams_default_instance_)();
  }
  if (DAT_00723720 == '\x01') {
    DAT_00723720 = '\0';
    (*(code *)*_ConcatLayerParams_default_instance_)();
  }
  if (DAT_00723750 == '\x01') {
    DAT_00723750 = '\0';
    (*(code *)*_LRNLayerParams_default_instance_)();
  }
  if (DAT_00723770 == '\x01') {
    DAT_00723770 = '\0';
    (*(code *)*_SoftmaxLayerParams_default_instance_)();
  }
  if (DAT_00723798 == '\x01') {
    DAT_00723798 = '\0';
    (*(code *)*_SplitLayerParams_default_instance_)();
  }
  if (DAT_007237b8 == '\x01') {
    DAT_007237b8 = '\0';
    (*(code *)*_AddLayerParams_default_instance_)();
  }
  if (DAT_007237d8 == '\x01') {
    DAT_007237d8 = '\0';
    (*(code *)*_MultiplyLayerParams_default_instance_)();
  }
  if (DAT_00723808 == '\x01') {
    DAT_00723808 = '\0';
    (*(code *)*_UnaryFunctionLayerParams_default_instance_)();
  }
  if (DAT_00723858 == '\x01') {
    DAT_00723858 = '\0';
    (*(code *)*_UpsampleLayerParams_default_instance_)();
  }
  if (DAT_00723898 == '\x01') {
    DAT_00723898 = '\0';
    (*(code *)*_ResizeBilinearLayerParams_default_instance_)();
  }
  if (DAT_007238e8 == '\x01') {
    DAT_007238e8 = '\0';
    (*(code *)*_CropResizeLayerParams_default_instance_)();
  }
  if (DAT_00723928 == '\x01') {
    DAT_00723928 = '\0';
    (*(code *)*_BiasLayerParams_default_instance_)();
  }
  if (DAT_00723988 == '\x01') {
    DAT_00723988 = '\0';
    (*(code *)*_ScaleLayerParams_default_instance_)();
  }
  if (DAT_007239c8 == '\x01') {
    DAT_007239c8 = '\0';
    (*(code *)*_LoadConstantLayerParams_default_instance_)();
  }
  if (DAT_007239e8 == '\x01') {
    DAT_007239e8 = '\0';
    (*(code *)*_L2NormalizeLayerParams_default_instance_)();
  }
  if (DAT_00723a08 == '\x01') {
    DAT_00723a08 = '\0';
    (*(code *)*_FlattenLayerParams_default_instance_)();
  }
  if (DAT_00723a40 == '\x01') {
    DAT_00723a40 = '\0';
    (*(code *)*_ReshapeLayerParams_default_instance_)();
  }
  if (DAT_00723a70 == '\x01') {
    DAT_00723a70 = '\0';
    (*(code *)*_PermuteLayerParams_default_instance_)();
  }
  if (DAT_00723a98 == '\x01') {
    DAT_00723a98 = '\0';
    (*(code *)*_ReorganizeDataLayerParams_default_instance_)();
  }
  if (DAT_00723ad0 == '\x01') {
    DAT_00723ad0 = '\0';
    (*(code *)*_SliceLayerParams_default_instance_)();
  }
  if (DAT_00723af8 == '\x01') {
    DAT_00723af8 = '\0';
    (*(code *)*_ReduceLayerParams_default_instance_)();
  }
  if (DAT_00723b38 == '\x01') {
    DAT_00723b38 = '\0';
    (*(code *)*_CropLayerParams_default_instance_)();
  }
  if (DAT_00723b58 == '\x01') {
    DAT_00723b58 = '\0';
    (*(code *)*_AverageLayerParams_default_instance_)();
  }
  if (DAT_00723b78 == '\x01') {
    DAT_00723b78 = '\0';
    (*(code *)*_MaxLayerParams_default_instance_)();
  }
  if (DAT_00723b98 == '\x01') {
    DAT_00723b98 = '\0';
    (*(code *)*_MinLayerParams_default_instance_)();
  }
  if (DAT_00723bb8 == '\x01') {
    DAT_00723bb8 = '\0';
    (*(code *)*_DotProductLayerParams_default_instance_)();
  }
  if (DAT_00723be0 == '\x01') {
    DAT_00723be0 = '\0';
    (*(code *)*_MeanVarianceNormalizeLayerParams_default_instance_)();
  }
  if (DAT_00723c08 == '\x01') {
    DAT_00723c08 = '\0';
    (*(code *)*_SequenceRepeatLayerParams_default_instance_)();
  }
  if (DAT_00723c58 == '\x01') {
    DAT_00723c58 = '\0';
    (*(code *)*_SimpleRecurrentLayerParams_default_instance_)();
  }
  if (DAT_00723ce8 == '\x01') {
    DAT_00723ce8 = '\0';
    (*(code *)*_GRULayerParams_default_instance_)();
  }
  if (DAT_00723d10 == '\x01') {
    DAT_00723d10 = '\0';
    (*(code *)*_LSTMParams_default_instance_)();
  }
  if (DAT_00723da8 == '\x01') {
    DAT_00723da8 = '\0';
    (*(code *)*_LSTMWeightParams_default_instance_)();
  }
  if (DAT_00723e00 == '\x01') {
    DAT_00723e00 = '\0';
    (*(code *)*_UniDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00723e80 == '\x01') {
    DAT_00723e80 = '\0';
    (*(code *)*_BiDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00723ea8 == '\x01') {
    DAT_00723ea8 = '\0';
    (*(code *)*_CustomLayerParams_CustomLayerParamValue_default_instance_)();
  }
  if (DAT_00723f70 == '\x01') {
    DAT_00723f70 = '\0';
    (*(code *)*_CustomLayerParams_default_instance_)();
  }
  if (DAT_00723fa0 == '\x01') {
    DAT_00723fa0 = '\0';
    (*(code *)*_TransposeLayerParams_default_instance_)();
  }
  if (DAT_00723fe0 == '\x01') {
    DAT_00723fe0 = '\0';
    (*(code *)*_BatchedMatMulLayerParams_default_instance_)();
  }
  if (DAT_00724008 == '\x01') {
    DAT_00724008 = '\0';
    (*(code *)*_ConcatNDLayerParams_default_instance_)();
  }
  if (DAT_00724030 == '\x01') {
    DAT_00724030 = '\0';
    (*(code *)*_SoftmaxNDLayerParams_default_instance_)();
  }
  if (DAT_00724060 == '\x01') {
    DAT_00724060 = '\0';
    (*(code *)*_ReverseLayerParams_default_instance_)();
  }
  if (DAT_00724090 == '\x01') {
    DAT_00724090 = '\0';
    (*(code *)*_ReverseSeqLayerParams_default_instance_)();
  }
  if (DAT_007240d0 == '\x01') {
    DAT_007240d0 = '\0';
    (*(code *)*_LoadConstantNDLayerParams_default_instance_)();
  }
  if (DAT_007240f0 == '\x01') {
    DAT_007240f0 = '\0';
    (*(code *)*_FillLikeLayerParams_default_instance_)();
  }
  if (DAT_00724128 == '\x01') {
    DAT_00724128 = '\0';
    (*(code *)*_FillStaticLayerParams_default_instance_)();
  }
  if (DAT_00724148 == '\x01') {
    DAT_00724148 = '\0';
    (*(code *)*_FillDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724168 == '\x01') {
    DAT_00724168 = '\0';
    (*(code *)*_WhereBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724188 == '\x01') {
    DAT_00724188 = '\0';
    (*(code *)*_SinLayerParams_default_instance_)();
  }
  if (DAT_007241a8 == '\x01') {
    DAT_007241a8 = '\0';
    (*(code *)*_CosLayerParams_default_instance_)();
  }
  if (DAT_007241c8 == '\x01') {
    DAT_007241c8 = '\0';
    (*(code *)*_TanLayerParams_default_instance_)();
  }
  if (DAT_007241e8 == '\x01') {
    DAT_007241e8 = '\0';
    (*(code *)*_AsinLayerParams_default_instance_)();
  }
  if (DAT_00724208 == '\x01') {
    DAT_00724208 = '\0';
    (*(code *)*_AcosLayerParams_default_instance_)();
  }
  if (DAT_00724228 == '\x01') {
    DAT_00724228 = '\0';
    (*(code *)*_AtanLayerParams_default_instance_)();
  }
  if (DAT_00724248 == '\x01') {
    DAT_00724248 = '\0';
    (*(code *)*_SinhLayerParams_default_instance_)();
  }
  if (DAT_00724268 == '\x01') {
    DAT_00724268 = '\0';
    (*(code *)*_CoshLayerParams_default_instance_)();
  }
  if (DAT_00724288 == '\x01') {
    DAT_00724288 = '\0';
    (*(code *)*_TanhLayerParams_default_instance_)();
  }
  if (DAT_007242a8 == '\x01') {
    DAT_007242a8 = '\0';
    (*(code *)*_AsinhLayerParams_default_instance_)();
  }
  if (DAT_007242c8 == '\x01') {
    DAT_007242c8 = '\0';
    (*(code *)*_AcoshLayerParams_default_instance_)();
  }
  if (DAT_007242e8 == '\x01') {
    DAT_007242e8 = '\0';
    (*(code *)*_AtanhLayerParams_default_instance_)();
  }
  if (DAT_00724308 == '\x01') {
    DAT_00724308 = '\0';
    (*(code *)*_PowBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724328 == '\x01') {
    DAT_00724328 = '\0';
    (*(code *)*_Exp2LayerParams_default_instance_)();
  }
  if (DAT_00724348 == '\x01') {
    DAT_00724348 = '\0';
    (*(code *)*_WhereNonZeroLayerParams_default_instance_)();
  }
  if (DAT_00724378 == '\x01') {
    DAT_00724378 = '\0';
    (*(code *)*_MatrixBandPartLayerParams_default_instance_)();
  }
  if (DAT_007243a0 == '\x01') {
    DAT_007243a0 = '\0';
    (*(code *)*_UpperTriangularLayerParams_default_instance_)();
  }
  if (DAT_007243c8 == '\x01') {
    DAT_007243c8 = '\0';
    (*(code *)*_LowerTriangularLayerParams_default_instance_)();
  }
  if (DAT_007243e8 == '\x01') {
    DAT_007243e8 = '\0';
    (*(code *)*_BroadcastToLikeLayerParams_default_instance_)();
  }
  if (DAT_00724418 == '\x01') {
    DAT_00724418 = '\0';
    (*(code *)*_BroadcastToStaticLayerParams_default_instance_)();
  }
  if (DAT_00724438 == '\x01') {
    DAT_00724438 = '\0';
    (*(code *)*_BroadcastToDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724458 == '\x01') {
    DAT_00724458 = '\0';
    (*(code *)*_AddBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724478 == '\x01') {
    DAT_00724478 = '\0';
    (*(code *)*_MaxBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724498 == '\x01') {
    DAT_00724498 = '\0';
    (*(code *)*_MinBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007244b8 == '\x01') {
    DAT_007244b8 = '\0';
    (*(code *)*_ModBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007244d8 == '\x01') {
    DAT_007244d8 = '\0';
    (*(code *)*_FloorDivBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007244f8 == '\x01') {
    DAT_007244f8 = '\0';
    (*(code *)*_SubtractBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724518 == '\x01') {
    DAT_00724518 = '\0';
    (*(code *)*_MultiplyBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724538 == '\x01') {
    DAT_00724538 = '\0';
    (*(code *)*_DivideBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00724560 == '\x01') {
    DAT_00724560 = '\0';
    (*(code *)*_GatherLayerParams_default_instance_)();
  }
  if (DAT_00724588 == '\x01') {
    DAT_00724588 = '\0';
    (*(code *)*_ScatterLayerParams_default_instance_)();
  }
  if (DAT_007245a8 == '\x01') {
    DAT_007245a8 = '\0';
    (*(code *)*_GatherNDLayerParams_default_instance_)();
  }
  if (DAT_007245c8 == '\x01') {
    DAT_007245c8 = '\0';
    (*(code *)*_ScatterNDLayerParams_default_instance_)();
  }
  if (DAT_007245f0 == '\x01') {
    DAT_007245f0 = '\0';
    (*(code *)*_GatherAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_00724618 == '\x01') {
    DAT_00724618 = '\0';
    (*(code *)*_ScatterAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_00724640 == '\x01') {
    DAT_00724640 = '\0';
    (*(code *)*_StackLayerParams_default_instance_)();
  }
  if (DAT_00724670 == '\x01') {
    DAT_00724670 = '\0';
    (*(code *)*_RankPreservingReshapeLayerParams_default_instance_)();
  }
  if (DAT_007246a8 == '\x01') {
    DAT_007246a8 = '\0';
    (*(code *)*_ConstantPaddingLayerParams_default_instance_)();
  }
  if (DAT_007246d8 == '\x01') {
    DAT_007246d8 = '\0';
    (*(code *)*_RandomNormalLikeLayerParams_default_instance_)();
  }
  if (DAT_00724720 == '\x01') {
    DAT_00724720 = '\0';
    (*(code *)*_RandomNormalStaticLayerParams_default_instance_)();
  }
  if (DAT_00724750 == '\x01') {
    DAT_00724750 = '\0';
    (*(code *)*_RandomNormalDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724780 == '\x01') {
    DAT_00724780 = '\0';
    (*(code *)*_RandomUniformLikeLayerParams_default_instance_)();
  }
  if (DAT_007247c8 == '\x01') {
    DAT_007247c8 = '\0';
    (*(code *)*_RandomUniformStaticLayerParams_default_instance_)();
  }
  if (DAT_007247f8 == '\x01') {
    DAT_007247f8 = '\0';
    (*(code *)*_RandomUniformDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724820 == '\x01') {
    DAT_00724820 = '\0';
    (*(code *)*_RandomBernoulliLikeLayerParams_default_instance_)();
  }
  if (DAT_00724860 == '\x01') {
    DAT_00724860 = '\0';
    (*(code *)*_RandomBernoulliStaticLayerParams_default_instance_)();
  }
  if (DAT_00724888 == '\x01') {
    DAT_00724888 = '\0';
    (*(code *)*_RandomBernoulliDynamicLayerParams_default_instance_)();
  }
  if (DAT_007248c0 == '\x01') {
    DAT_007248c0 = '\0';
    (*(code *)*_CategoricalDistributionLayerParams_default_instance_)();
  }
  if (DAT_007248f8 == '\x01') {
    DAT_007248f8 = '\0';
    (*(code *)*_ReduceL1LayerParams_default_instance_)();
  }
  if (DAT_00724930 == '\x01') {
    DAT_00724930 = '\0';
    (*(code *)*_ReduceL2LayerParams_default_instance_)();
  }
  if (DAT_00724968 == '\x01') {
    DAT_00724968 = '\0';
    (*(code *)*_ReduceMaxLayerParams_default_instance_)();
  }
  if (DAT_007249a0 == '\x01') {
    DAT_007249a0 = '\0';
    (*(code *)*_ReduceMinLayerParams_default_instance_)();
  }
  if (DAT_007249d8 == '\x01') {
    DAT_007249d8 = '\0';
    (*(code *)*_ReduceSumLayerParams_default_instance_)();
  }
  if (DAT_00724a10 == '\x01') {
    DAT_00724a10 = '\0';
    (*(code *)*_ReduceProdLayerParams_default_instance_)();
  }
  if (DAT_00724a48 == '\x01') {
    DAT_00724a48 = '\0';
    (*(code *)*_ReduceMeanLayerParams_default_instance_)();
  }
  if (DAT_00724a80 == '\x01') {
    DAT_00724a80 = '\0';
    (*(code *)*_ReduceLogSumLayerParams_default_instance_)();
  }
  if (DAT_00724ab8 == '\x01') {
    DAT_00724ab8 = '\0';
    (*(code *)*_ReduceSumSquareLayerParams_default_instance_)();
  }
  if (DAT_00724af0 == '\x01') {
    DAT_00724af0 = '\0';
    (*(code *)*_ReduceLogSumExpLayerParams_default_instance_)();
  }
  if (DAT_00724b20 == '\x01') {
    DAT_00724b20 = '\0';
    (*(code *)*_ExpandDimsLayerParams_default_instance_)();
  }
  if (DAT_00724b48 == '\x01') {
    DAT_00724b48 = '\0';
    (*(code *)*_FlattenTo2DLayerParams_default_instance_)();
  }
  if (DAT_00724b78 == '\x01') {
    DAT_00724b78 = '\0';
    (*(code *)*_ReshapeStaticLayerParams_default_instance_)();
  }
  if (DAT_00724b98 == '\x01') {
    DAT_00724b98 = '\0';
    (*(code *)*_ReshapeLikeLayerParams_default_instance_)();
  }
  if (DAT_00724bb8 == '\x01') {
    DAT_00724bb8 = '\0';
    (*(code *)*_ReshapeDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724bf0 == '\x01') {
    DAT_00724bf0 = '\0';
    (*(code *)*_SqueezeLayerParams_default_instance_)();
  }
  if (DAT_00724c20 == '\x01') {
    DAT_00724c20 = '\0';
    (*(code *)*_TopKLayerParams_default_instance_)();
  }
  if (DAT_00724c48 == '\x01') {
    DAT_00724c48 = '\0';
    (*(code *)*_ArgMaxLayerParams_default_instance_)();
  }
  if (DAT_00724c70 == '\x01') {
    DAT_00724c70 = '\0';
    (*(code *)*_ArgMinLayerParams_default_instance_)();
  }
  if (DAT_00724cb8 == '\x01') {
    DAT_00724cb8 = '\0';
    (*(code *)*_SplitNDLayerParams_default_instance_)();
  }
  if (DAT_00724cd8 == '\x01') {
    DAT_00724cd8 = '\0';
    (*(code *)*_CeilLayerParams_default_instance_)();
  }
  if (DAT_00724cf8 == '\x01') {
    DAT_00724cf8 = '\0';
    (*(code *)*_RoundLayerParams_default_instance_)();
  }
  if (DAT_00724d18 == '\x01') {
    DAT_00724d18 = '\0';
    (*(code *)*_FloorLayerParams_default_instance_)();
  }
  if (DAT_00724d38 == '\x01') {
    DAT_00724d38 = '\0';
    (*(code *)*_SignLayerParams_default_instance_)();
  }
  if (DAT_00724d60 == '\x01') {
    DAT_00724d60 = '\0';
    (*(code *)*_ClipLayerParams_default_instance_)();
  }
  if (DAT_00724e08 == '\x01') {
    DAT_00724e08 = '\0';
    (*(code *)*_SliceStaticLayerParams_default_instance_)();
  }
  if (DAT_00724e98 == '\x01') {
    DAT_00724e98 = '\0';
    (*(code *)*_SliceDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724ec8 == '\x01') {
    DAT_00724ec8 = '\0';
    (*(code *)*_TileLayerParams_default_instance_)();
  }
  if (DAT_00724ee8 == '\x01') {
    DAT_00724ee8 = '\0';
    (*(code *)*_GetShapeLayerParams_default_instance_)();
  }
  if (DAT_00724f08 == '\x01') {
    DAT_00724f08 = '\0';
    (*(code *)*_ErfLayerParams_default_instance_)();
  }
  if (DAT_00724f28 == '\x01') {
    DAT_00724f28 = '\0';
    (*(code *)*_GeluLayerParams_default_instance_)();
  }
  if (DAT_00724f50 == '\x01') {
    DAT_00724f50 = '\0';
    (*(code *)*_RangeStaticLayerParams_default_instance_)();
  }
  if (DAT_00724f78 == '\x01') {
    DAT_00724f78 = '\0';
    (*(code *)*_RangeDynamicLayerParams_default_instance_)();
  }
  if (DAT_00724fb0 == '\x01') {
    DAT_00724fb0 = '\0';
    (*(code *)*_SlidingWindowsLayerParams_default_instance_)();
  }
  if (DAT_00724ff8 == '\x01') {
    DAT_00724ff8 = '\0';
    (*(code *)*_LayerNormalizationLayerParams_default_instance_)();
  }
  if (DAT_00725028 == '\x01') {
    DAT_00725028 = '\0';
    (*(code *)*_NonMaximumSuppressionLayerParams_default_instance_)();
  }
  if (DAT_00725050 == '\x01') {
    DAT_00725050 = '\0';
    (*(code *)*_ClampedReLULayerParams_default_instance_)();
  }
  if (DAT_00725078 == '\x01') {
    DAT_00725078 = '\0';
    (*(code *)*_ArgSortLayerParams_default_instance_)();
  }
  if (DAT_007250a8 == '\x01') {
    DAT_007250a8 = '\0';
    (*(code *)*_SliceBySizeLayerParams_default_instance_)();
  }
  if (DAT_00725118 == '\x01') {
    DAT_00725118 = '\0';
    (*(code *)*_NeuralNetworkClassifier_default_instance_)();
  }
  if (DAT_00725160 == '\x01') {
    DAT_00725160 = '\0';
    (*(code *)*_OneHotLayerParams_default_instance_)();
  }
  if (DAT_00725188 == '\x01') {
    DAT_00725188 = '\0';
    (*(code *)*_CumSumLayerParams_default_instance_)();
  }
  if (DAT_007251e8 == '\x01') {
    DAT_007251e8 = '\0';
    (*(code *)*_NeuralNetworkRegressor_default_instance_)();
  }
  if (DAT_00725240 == '\x01') {
    DAT_00725240 = '\0';
    (*(code *)*_NetworkUpdateParameters_default_instance_)();
  }
  if (DAT_00725270 == '\x01') {
    DAT_00725270 = '\0';
    (*(code *)*_LossLayer_default_instance_)();
  }
  if (DAT_007252b0 == '\x01') {
    DAT_007252b0 = '\0';
    (*(code *)*_CategoricalCrossEntropyLossLayer_default_instance_)();
  }
  if (DAT_007252e0 == '\x01') {
    DAT_007252e0 = '\0';
    (*(code *)*_MeanSquaredErrorLossLayer_default_instance_)();
  }
  if (DAT_00725308 == '\x01') {
    DAT_00725308 = '\0';
    (*(code *)*_Optimizer_default_instance_)();
  }
  if (DAT_00725350 == '\x01') {
    DAT_00725350 = '\0';
    (*(code *)*_SGDOptimizer_default_instance_)();
  }
  if (DAT_00725398 == '\x01') {
    DAT_00725398 = 0;
    (*(code *)*_AdamOptimizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NeuralNetwork_default_instance_.Shutdown();
  _NeuralNetworkImageScaler_default_instance_.Shutdown();
  _NeuralNetworkMeanImage_default_instance_.Shutdown();
  _NeuralNetworkPreprocessing_default_instance_.Shutdown();
  _ActivationReLU_default_instance_.Shutdown();
  _ActivationLeakyReLU_default_instance_.Shutdown();
  _ActivationTanh_default_instance_.Shutdown();
  _ActivationScaledTanh_default_instance_.Shutdown();
  _ActivationSigmoid_default_instance_.Shutdown();
  _ActivationLinear_default_instance_.Shutdown();
  _ActivationSigmoidHard_default_instance_.Shutdown();
  _ActivationPReLU_default_instance_.Shutdown();
  _ActivationELU_default_instance_.Shutdown();
  _ActivationThresholdedReLU_default_instance_.Shutdown();
  _ActivationSoftsign_default_instance_.Shutdown();
  _ActivationSoftplus_default_instance_.Shutdown();
  _ActivationParametricSoftplus_default_instance_.Shutdown();
  _ActivationParams_default_instance_.Shutdown();
  _Tensor_default_instance_.Shutdown();
  _NeuralNetworkLayer_default_instance_.Shutdown();
  _BranchLayerParams_default_instance_.Shutdown();
  _LoopLayerParams_default_instance_.Shutdown();
  _LoopBreakLayerParams_default_instance_.Shutdown();
  _LoopContinueLayerParams_default_instance_.Shutdown();
  _CopyLayerParams_default_instance_.Shutdown();
  _GreaterThanLayerParams_default_instance_.Shutdown();
  _GreaterEqualLayerParams_default_instance_.Shutdown();
  _LessThanLayerParams_default_instance_.Shutdown();
  _LessEqualLayerParams_default_instance_.Shutdown();
  _EqualLayerParams_default_instance_.Shutdown();
  _NotEqualLayerParams_default_instance_.Shutdown();
  _LogicalAndLayerParams_default_instance_.Shutdown();
  _LogicalOrLayerParams_default_instance_.Shutdown();
  _LogicalXorLayerParams_default_instance_.Shutdown();
  _LogicalNotLayerParams_default_instance_.Shutdown();
  _BorderAmounts_EdgeSizes_default_instance_.Shutdown();
  _BorderAmounts_default_instance_.Shutdown();
  _ValidPadding_default_instance_.Shutdown();
  _SamePadding_default_instance_.Shutdown();
  _SamplingMode_default_instance_.Shutdown();
  _BoxCoordinatesMode_default_instance_.Shutdown();
  _WeightParams_default_instance_.Shutdown();
  _QuantizationParams_default_instance_.Shutdown();
  _LinearQuantizationParams_default_instance_.Shutdown();
  _LookUpTableQuantizationParams_default_instance_.Shutdown();
  _ConvolutionLayerParams_default_instance_.Shutdown();
  _Convolution3DLayerParams_default_instance_.Shutdown();
  _InnerProductLayerParams_default_instance_.Shutdown();
  _EmbeddingLayerParams_default_instance_.Shutdown();
  _EmbeddingNDLayerParams_default_instance_.Shutdown();
  _BatchnormLayerParams_default_instance_.Shutdown();
  _PoolingLayerParams_ValidCompletePadding_default_instance_.Shutdown();
  _PoolingLayerParams_default_instance_.Shutdown();
  _Pooling3DLayerParams_default_instance_.Shutdown();
  _GlobalPooling3DLayerParams_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingConstant_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReflection_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReplication_default_instance_.Shutdown();
  _PaddingLayerParams_default_instance_.Shutdown();
  _ConcatLayerParams_default_instance_.Shutdown();
  _LRNLayerParams_default_instance_.Shutdown();
  _SoftmaxLayerParams_default_instance_.Shutdown();
  _SplitLayerParams_default_instance_.Shutdown();
  _AddLayerParams_default_instance_.Shutdown();
  _MultiplyLayerParams_default_instance_.Shutdown();
  _UnaryFunctionLayerParams_default_instance_.Shutdown();
  _UpsampleLayerParams_default_instance_.Shutdown();
  _ResizeBilinearLayerParams_default_instance_.Shutdown();
  _CropResizeLayerParams_default_instance_.Shutdown();
  _BiasLayerParams_default_instance_.Shutdown();
  _ScaleLayerParams_default_instance_.Shutdown();
  _LoadConstantLayerParams_default_instance_.Shutdown();
  _L2NormalizeLayerParams_default_instance_.Shutdown();
  _FlattenLayerParams_default_instance_.Shutdown();
  _ReshapeLayerParams_default_instance_.Shutdown();
  _PermuteLayerParams_default_instance_.Shutdown();
  _ReorganizeDataLayerParams_default_instance_.Shutdown();
  _SliceLayerParams_default_instance_.Shutdown();
  _ReduceLayerParams_default_instance_.Shutdown();
  _CropLayerParams_default_instance_.Shutdown();
  _AverageLayerParams_default_instance_.Shutdown();
  _MaxLayerParams_default_instance_.Shutdown();
  _MinLayerParams_default_instance_.Shutdown();
  _DotProductLayerParams_default_instance_.Shutdown();
  _MeanVarianceNormalizeLayerParams_default_instance_.Shutdown();
  _SequenceRepeatLayerParams_default_instance_.Shutdown();
  _SimpleRecurrentLayerParams_default_instance_.Shutdown();
  _GRULayerParams_default_instance_.Shutdown();
  _LSTMParams_default_instance_.Shutdown();
  _LSTMWeightParams_default_instance_.Shutdown();
  _UniDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _BiDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _CustomLayerParams_CustomLayerParamValue_default_instance_.Shutdown();
  _CustomLayerParams_default_instance_.Shutdown();
  _TransposeLayerParams_default_instance_.Shutdown();
  _BatchedMatMulLayerParams_default_instance_.Shutdown();
  _ConcatNDLayerParams_default_instance_.Shutdown();
  _SoftmaxNDLayerParams_default_instance_.Shutdown();
  _ReverseLayerParams_default_instance_.Shutdown();
  _ReverseSeqLayerParams_default_instance_.Shutdown();
  _LoadConstantNDLayerParams_default_instance_.Shutdown();
  _FillLikeLayerParams_default_instance_.Shutdown();
  _FillStaticLayerParams_default_instance_.Shutdown();
  _FillDynamicLayerParams_default_instance_.Shutdown();
  _WhereBroadcastableLayerParams_default_instance_.Shutdown();
  _SinLayerParams_default_instance_.Shutdown();
  _CosLayerParams_default_instance_.Shutdown();
  _TanLayerParams_default_instance_.Shutdown();
  _AsinLayerParams_default_instance_.Shutdown();
  _AcosLayerParams_default_instance_.Shutdown();
  _AtanLayerParams_default_instance_.Shutdown();
  _SinhLayerParams_default_instance_.Shutdown();
  _CoshLayerParams_default_instance_.Shutdown();
  _TanhLayerParams_default_instance_.Shutdown();
  _AsinhLayerParams_default_instance_.Shutdown();
  _AcoshLayerParams_default_instance_.Shutdown();
  _AtanhLayerParams_default_instance_.Shutdown();
  _PowBroadcastableLayerParams_default_instance_.Shutdown();
  _Exp2LayerParams_default_instance_.Shutdown();
  _WhereNonZeroLayerParams_default_instance_.Shutdown();
  _MatrixBandPartLayerParams_default_instance_.Shutdown();
  _UpperTriangularLayerParams_default_instance_.Shutdown();
  _LowerTriangularLayerParams_default_instance_.Shutdown();
  _BroadcastToLikeLayerParams_default_instance_.Shutdown();
  _BroadcastToStaticLayerParams_default_instance_.Shutdown();
  _BroadcastToDynamicLayerParams_default_instance_.Shutdown();
  _AddBroadcastableLayerParams_default_instance_.Shutdown();
  _MaxBroadcastableLayerParams_default_instance_.Shutdown();
  _MinBroadcastableLayerParams_default_instance_.Shutdown();
  _ModBroadcastableLayerParams_default_instance_.Shutdown();
  _FloorDivBroadcastableLayerParams_default_instance_.Shutdown();
  _SubtractBroadcastableLayerParams_default_instance_.Shutdown();
  _MultiplyBroadcastableLayerParams_default_instance_.Shutdown();
  _DivideBroadcastableLayerParams_default_instance_.Shutdown();
  _GatherLayerParams_default_instance_.Shutdown();
  _ScatterLayerParams_default_instance_.Shutdown();
  _GatherNDLayerParams_default_instance_.Shutdown();
  _ScatterNDLayerParams_default_instance_.Shutdown();
  _GatherAlongAxisLayerParams_default_instance_.Shutdown();
  _ScatterAlongAxisLayerParams_default_instance_.Shutdown();
  _StackLayerParams_default_instance_.Shutdown();
  _RankPreservingReshapeLayerParams_default_instance_.Shutdown();
  _ConstantPaddingLayerParams_default_instance_.Shutdown();
  _RandomNormalLikeLayerParams_default_instance_.Shutdown();
  _RandomNormalStaticLayerParams_default_instance_.Shutdown();
  _RandomNormalDynamicLayerParams_default_instance_.Shutdown();
  _RandomUniformLikeLayerParams_default_instance_.Shutdown();
  _RandomUniformStaticLayerParams_default_instance_.Shutdown();
  _RandomUniformDynamicLayerParams_default_instance_.Shutdown();
  _RandomBernoulliLikeLayerParams_default_instance_.Shutdown();
  _RandomBernoulliStaticLayerParams_default_instance_.Shutdown();
  _RandomBernoulliDynamicLayerParams_default_instance_.Shutdown();
  _CategoricalDistributionLayerParams_default_instance_.Shutdown();
  _ReduceL1LayerParams_default_instance_.Shutdown();
  _ReduceL2LayerParams_default_instance_.Shutdown();
  _ReduceMaxLayerParams_default_instance_.Shutdown();
  _ReduceMinLayerParams_default_instance_.Shutdown();
  _ReduceSumLayerParams_default_instance_.Shutdown();
  _ReduceProdLayerParams_default_instance_.Shutdown();
  _ReduceMeanLayerParams_default_instance_.Shutdown();
  _ReduceLogSumLayerParams_default_instance_.Shutdown();
  _ReduceSumSquareLayerParams_default_instance_.Shutdown();
  _ReduceLogSumExpLayerParams_default_instance_.Shutdown();
  _ExpandDimsLayerParams_default_instance_.Shutdown();
  _FlattenTo2DLayerParams_default_instance_.Shutdown();
  _ReshapeStaticLayerParams_default_instance_.Shutdown();
  _ReshapeLikeLayerParams_default_instance_.Shutdown();
  _ReshapeDynamicLayerParams_default_instance_.Shutdown();
  _SqueezeLayerParams_default_instance_.Shutdown();
  _TopKLayerParams_default_instance_.Shutdown();
  _ArgMaxLayerParams_default_instance_.Shutdown();
  _ArgMinLayerParams_default_instance_.Shutdown();
  _SplitNDLayerParams_default_instance_.Shutdown();
  _CeilLayerParams_default_instance_.Shutdown();
  _RoundLayerParams_default_instance_.Shutdown();
  _FloorLayerParams_default_instance_.Shutdown();
  _SignLayerParams_default_instance_.Shutdown();
  _ClipLayerParams_default_instance_.Shutdown();
  _SliceStaticLayerParams_default_instance_.Shutdown();
  _SliceDynamicLayerParams_default_instance_.Shutdown();
  _TileLayerParams_default_instance_.Shutdown();
  _GetShapeLayerParams_default_instance_.Shutdown();
  _ErfLayerParams_default_instance_.Shutdown();
  _GeluLayerParams_default_instance_.Shutdown();
  _RangeStaticLayerParams_default_instance_.Shutdown();
  _RangeDynamicLayerParams_default_instance_.Shutdown();
  _SlidingWindowsLayerParams_default_instance_.Shutdown();
  _LayerNormalizationLayerParams_default_instance_.Shutdown();
  _NonMaximumSuppressionLayerParams_default_instance_.Shutdown();
  _ClampedReLULayerParams_default_instance_.Shutdown();
  _ArgSortLayerParams_default_instance_.Shutdown();
  _SliceBySizeLayerParams_default_instance_.Shutdown();
  _NeuralNetworkClassifier_default_instance_.Shutdown();
  _OneHotLayerParams_default_instance_.Shutdown();
  _CumSumLayerParams_default_instance_.Shutdown();
  _NeuralNetworkRegressor_default_instance_.Shutdown();
  _NetworkUpdateParameters_default_instance_.Shutdown();
  _LossLayer_default_instance_.Shutdown();
  _CategoricalCrossEntropyLossLayer_default_instance_.Shutdown();
  _MeanSquaredErrorLossLayer_default_instance_.Shutdown();
  _Optimizer_default_instance_.Shutdown();
  _SGDOptimizer_default_instance_.Shutdown();
  _AdamOptimizer_default_instance_.Shutdown();
}